

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O1

void __thiscall sptk::SymmetricMatrix::Resize(SymmetricMatrix *this,int num_dimension)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0;
  if (num_dimension < 1) {
    num_dimension = 0;
  }
  this->num_dimension_ = num_dimension;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->data_,(ulong)((uint)(num_dimension * (num_dimension + 1)) >> 1));
  std::vector<double_*,_std::allocator<double_*>_>::resize(&this->index_,(long)this->num_dimension_)
  ;
  iVar1 = this->num_dimension_;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] =
           (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + uVar3;
      lVar2 = lVar2 + 1;
      uVar3 = (ulong)(uint)((int)uVar3 + (int)lVar2);
    } while (iVar1 != lVar2);
  }
  return;
}

Assistant:

void SymmetricMatrix::Resize(int num_dimension) {
  num_dimension_ = num_dimension < 0 ? 0 : num_dimension;
  data_.resize(num_dimension_ * (num_dimension_ + 1) / 2);
  index_.resize(num_dimension_);

  for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
    index_[i] = &data_[j];
  }
}